

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_ConstructorGetter_Test::~Transaction_ConstructorGetter_Test
          (Transaction_ConstructorGetter_Test *this)

{
  Transaction_ConstructorGetter_Test *this_local;
  
  ~Transaction_ConstructorGetter_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Transaction, ConstructorGetter) {
  {
    Transaction empty_tx;
    EXPECT_EQ(empty_tx.GetVersion(), exp_version);
    EXPECT_EQ(empty_tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(empty_tx.GetHex().c_str(), "02000000000000000000");

    // new transaction
    Transaction tx(exp_version, exp_locktime);
    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetHash()).GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_STREQ(tx.GetHex().c_str(), "02000000000000000000");
    EXPECT_EQ(tx.GetTotalSize(), 10);
    EXPECT_EQ(tx.GetVsize(), 10);
    EXPECT_EQ(tx.GetWeight(), 40);
    EXPECT_EQ(tx.GetTxInCount(), 0);
    EXPECT_EQ(tx.GetTxOutCount(), 0);
    EXPECT_THROW(tx.GetTxIn(0), CfdException);
    EXPECT_THROW(tx.GetTxOut(0), CfdException);
    EXPECT_EQ(tx.HasWitness(), false);
  }

  {
    // hex to transaction(empty)
    Transaction tx("02000000000000000000");
    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetHash()).GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_EQ(tx.GetTotalSize(), 10);
    EXPECT_EQ(tx.GetVsize(), 10);
    EXPECT_EQ(tx.GetWeight(), 40);
    EXPECT_EQ(tx.GetTxInCount(), 0);
    EXPECT_EQ(tx.GetTxOutCount(), 0);
    EXPECT_THROW(tx.GetTxIn(0), CfdException);
    EXPECT_THROW(tx.GetTxOut(0), CfdException);
    EXPECT_EQ(tx.HasWitness(), false);
  }

  {
    // hex to transaction(witness)
    Transaction tx(exp_tx_witness);

    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetWitnessHash()).GetHex().c_str(),
        "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
    EXPECT_EQ(tx.GetTotalSize(), 247);
    EXPECT_EQ(tx.GetVsize(), 166);
    EXPECT_EQ(tx.GetWeight(), 661);
    EXPECT_NO_THROW(tx.GetTxIn(0));
    EXPECT_THROW(tx.GetTxIn(1), CfdException);
    EXPECT_EQ(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            0),
        0);
    EXPECT_THROW(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            1),
        CfdException);
    EXPECT_EQ(tx.GetTxInCount(), 1);
    EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
    EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 2);
    EXPECT_EQ(tx.GetTxOutCount(), 2);
    EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
    EXPECT_NO_THROW(tx.GetTxOut(0));
    EXPECT_EQ(
        tx.GetTxOutIndex(Script("a9142699570770f32e0cf3e1d12d81064fbc45899e8a87")),
        1);
    EXPECT_THROW(tx.GetTxOut(2), CfdException);
    EXPECT_EQ(tx.GetWallyFlag(), 1);
    EXPECT_EQ(tx.HasWitness(), true);
    EXPECT_THROW(
        tx.GetTxOutIndex(Script("a9142699570970f32e0cf3e1d12d81064fbc45899e8a87")),
        CfdException);
  }

  {
    ByteData exp_data = ByteData(exp_tx_witness);
    Transaction tx_b(exp_data);
    ByteData data = tx_b.GetData();
    EXPECT_STREQ(data.GetHex().c_str(), exp_tx_witness.c_str());
  }

  {
    // hex to transaction(legacy)
    Transaction tx(exp_tx_legacy);
    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetHash()).GetHex().c_str(),
        "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
    EXPECT_EQ(tx.GetTotalSize(), 189);
    EXPECT_EQ(tx.GetVsize(), 189);
    EXPECT_EQ(tx.GetWeight(), 756);
    EXPECT_NO_THROW(tx.GetTxIn(0));
    EXPECT_THROW(tx.GetTxIn(1), CfdException);
    EXPECT_EQ(
        tx.GetTxInIndex(
            Txid(
                "405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6"),
            0),
        0);
    EXPECT_THROW(
        tx.GetTxInIndex(
            Txid(
                "405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6"),
            1),
        CfdException);
    EXPECT_EQ(tx.GetTxInCount(), 1);
    EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
    EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
    EXPECT_EQ(tx.GetTxOutCount(), 1);
    EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
    EXPECT_NO_THROW(tx.GetTxOut(0));
    EXPECT_THROW(tx.GetTxOut(1), CfdException);
    EXPECT_EQ(tx.GetWallyFlag(), 1);
    EXPECT_EQ(tx.HasWitness(), false);
  }

  {
    // copy constructor
    Transaction copy_tx(exp_tx_witness);
    Transaction tx(copy_tx);

    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetWitnessHash()).GetHex().c_str(),
        "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
    EXPECT_EQ(tx.GetTotalSize(), 247);
    EXPECT_EQ(tx.GetVsize(), 166);
    EXPECT_EQ(tx.GetWeight(), 661);
    EXPECT_NO_THROW(tx.GetTxIn(0));
    EXPECT_THROW(tx.GetTxIn(1), CfdException);
    EXPECT_EQ(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            0),
        0);
    EXPECT_THROW(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            1),
        CfdException);
    EXPECT_EQ(tx.GetTxInCount(), 1);
    EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
    EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 2);
    EXPECT_EQ(tx.GetTxOutCount(), 2);
    EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
    EXPECT_NO_THROW(tx.GetTxOut(0));
    EXPECT_THROW(tx.GetTxOut(2), CfdException);
    EXPECT_EQ(tx.GetWallyFlag(), 1);
    EXPECT_EQ(tx.HasWitness(), true);
  }
}